

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

void aiMultiplyMatrix3(aiMatrix3x3 *dst,aiMatrix3x3 *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  if (dst == (aiMatrix3x3 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x28d,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
  }
  if (src != (aiMatrix3x3 *)0x0) {
    fVar1 = dst->a1;
    fVar2 = dst->a2;
    fVar3 = dst->a3;
    fVar4 = dst->b1;
    fVar5 = dst->b2;
    fVar6 = src->b1;
    fVar7 = src->a1;
    fVar8 = src->a2;
    fVar9 = src->c1;
    fVar10 = src->b2;
    fVar11 = src->c2;
    fVar12 = src->a3;
    fVar13 = src->b3;
    fVar14 = src->c3;
    fVar15 = dst->b3;
    fVar16 = dst->c2;
    fVar17 = dst->c1;
    fVar18 = dst->c3;
    dst->a1 = fVar9 * fVar3 + fVar7 * fVar1 + fVar2 * fVar6;
    dst->a2 = fVar11 * fVar3 + fVar8 * fVar1 + fVar2 * fVar10;
    dst->a3 = fVar3 * fVar14 + fVar1 * fVar12 + fVar2 * fVar13;
    dst->b1 = fVar9 * fVar15 + fVar7 * fVar4 + fVar5 * fVar6;
    dst->b2 = fVar11 * fVar15 + fVar8 * fVar4 + fVar5 * fVar10;
    dst->b3 = fVar15 * fVar14 + fVar4 * fVar12 + fVar5 * fVar13;
    dst->c1 = fVar9 * fVar18 + fVar7 * fVar17 + fVar6 * fVar16;
    dst->c2 = fVar11 * fVar18 + fVar8 * fVar17 + fVar10 * fVar16;
    dst->c3 = fVar14 * fVar18 + fVar12 * fVar17 + fVar16 * fVar13;
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x28e,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix3(
    aiMatrix3x3* dst,
    const aiMatrix3x3* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}